

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsAlternateSMPS(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (arg_count != 0) {
    if (target_driver < 3) {
      PrintError("Error: smpsAlternateSMPS is not supported in Sonic 1 or Sonic 2\'s driver\n");
    }
    WriteByte(0xfd);
    WriteByte((uchar)*arg_array);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x3ca,"void Macro_smpsAlternateSMPS(unsigned int, long *)");
}

Assistant:

static void Macro_smpsAlternateSMPS(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	if (target_driver < 3)
		PrintError("Error: smpsAlternateSMPS is not supported in Sonic 1 or Sonic 2's driver\n");

	WriteByte(0xFD);
	WriteByte(arg_array[0]);
}